

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_recompileAndOptimize
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_function_t **functionObject;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  _Var1 = sysbvm_tuple_isFunction(context,*arguments);
  if (!_Var1) {
    sysbvm_error("Expected a function.");
  }
  if ((*(long *)(*arguments + 0x48) != 0) &&
     (sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x38)), sVar2 != 0)) {
    sVar3 = sysbvm_interpreter_recompileAndOptimizeFunction(context,(sysbvm_function_t **)arguments)
    ;
    return sVar3;
  }
  return *arguments;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_recompileAndOptimize(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function)) sysbvm_error("Expected a function.");
    
    sysbvm_function_t **functionObject = (sysbvm_function_t**)function;
    if((*functionObject)->definition && sysbvm_array_getSize((*functionObject)->captureVector) > 0)
        return sysbvm_interpreter_recompileAndOptimizeFunction(context, functionObject);
    
    return *function;
}